

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vta_ManSatVerify(Vta_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Vta_Obj_t *pVVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *pThis;
  Vta_Man_t *p_local;
  
  local_34 = 1;
  pThis = (Vta_Obj_t *)p;
  while( true ) {
    bVar5 = false;
    if (local_34 < pThis[1].iObj) {
      pThis0 = Vta_ManObj((Vta_Man_t *)pThis,local_34);
      bVar5 = pThis0 != (Vta_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar3 = sat_solver2_var_value(*(sat_solver2 **)&pThis[7].iNext,local_34);
    iVar4 = 1;
    if (iVar3 != 0) {
      iVar4 = 2;
    }
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | iVar4 << 0x1c;
    local_34 = local_34 + 1;
  }
  local_34 = 1;
  do {
    bVar5 = false;
    if (local_34 < pThis[1].iObj) {
      pThis0 = Vta_ManObj((Vta_Man_t *)pThis,local_34);
      bVar5 = false;
      if (pThis0 != (Vta_Obj_t *)0x0) {
        pGStack_30 = Gia_ManObj(*(Gia_Man_t **)pThis,pThis0->iObj);
        bVar5 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar5) {
      return;
    }
    if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) != 0) {
      Vta_ObjPreds((Vta_Man_t *)pThis,pThis0,pGStack_30,&pThis1,(Vta_Obj_t **)&pObj);
      iVar4 = Gia_ObjIsAnd(pGStack_30);
      pVVar2 = pThis1;
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsRo(*(Gia_Man_t **)pThis,pGStack_30);
        if (iVar4 != 0) {
          pGStack_30 = Gia_ObjRoToRi(*(Gia_Man_t **)pThis,pGStack_30);
          pVVar2 = pThis1;
          if (pThis0->iFrame == 0) {
            if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
              __assert_fail("pThis->Value == VTA_VAR0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                            ,0x218,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
          else if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 1) {
            iVar4 = Gia_ObjFaninC0(pGStack_30);
            iVar4 = Vta_ValIs0(pVVar2,iVar4);
            if (iVar4 == 0) {
              __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                            ,0x21a,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
          else {
            if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                            ,0x21d,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
            iVar4 = Gia_ObjFaninC0(pGStack_30);
            iVar4 = Vta_ValIs1(pVVar2,iVar4);
            if (iVar4 == 0) {
              __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                            ,0x21c,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
        }
      }
      else if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 2) {
        iVar4 = Gia_ObjFaninC0(pGStack_30);
        iVar4 = Vta_ValIs1(pVVar2,iVar4);
        pGVar1 = pObj;
        if (iVar4 == 0) {
LAB_007ba6b6:
          __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x20f,"void Vta_ManSatVerify(Vta_Man_t *)");
        }
        iVar4 = Gia_ObjFaninC1(pGStack_30);
        iVar4 = Vta_ValIs1((Vta_Obj_t *)pGVar1,iVar4);
        if (iVar4 == 0) goto LAB_007ba6b6;
      }
      else {
        if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x212,"void Vta_ManSatVerify(Vta_Man_t *)");
        }
        iVar4 = Gia_ObjFaninC0(pGStack_30);
        iVar4 = Vta_ValIs0(pVVar2,iVar4);
        pGVar1 = pObj;
        if (iVar4 == 0) {
          iVar4 = Gia_ObjFaninC1(pGStack_30);
          iVar4 = Vta_ValIs0((Vta_Obj_t *)pGVar1,iVar4);
          if (iVar4 == 0) {
            __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                          ,0x211,"void Vta_ManSatVerify(Vta_Man_t *)");
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Vta_ManSatVerify( Vta_Man_t * p )
{
    Vta_Obj_t * pThis, * pThis0, * pThis1;
    Gia_Obj_t * pObj;
    int i;
    Vta_ManForEachObj( p, pThis, i )
        pThis->Value = (sat_solver2_var_value(p->pSat, i) ? VTA_VAR1 : VTA_VAR0);
    Vta_ManForEachObjObj( p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }
}